

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O3

void __thiscall
re2::RegexpGenerator::RunPostfix
          (RegexpGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *post)

{
  pointer pcVar1;
  RegexpGenerator *pRVar2;
  int iVar3;
  _Elt_pointer pbVar4;
  long *plVar5;
  undefined8 *puVar6;
  pointer pbVar7;
  size_type *psVar8;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *extraout_RDX_01;
  StringPiece *extraout_RDX_02;
  StringPiece *pSVar9;
  StringPiece *extraout_RDX_03;
  long lVar10;
  _Alloc_hider _Var11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string a;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  regexps;
  string b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string local_1f8;
  RegexpGenerator *local_1d8;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  local_248._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_248._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1d8 = this;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_248,0);
  pbVar7 = (post->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((post->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      iVar3 = CountArgs(*(string **)((long)&(pbVar7->_M_dataplus)._M_p + lVar10));
      if (iVar3 == 0) {
LAB_0011be7e:
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_248,(value_type *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10));
      }
      else {
        if (iVar3 == 1) {
          pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          local_1b0._0_8_ = local_1b0 + 0x10;
          pcVar1 = pbVar4[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,pcVar1,pcVar1 + pbVar4[-1]._M_string_length);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_248);
          StringPrintf_abi_cxx11_
                    (&local_1f8,
                     *(char **)((long)&(((post->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar10),local_1b0._0_8_);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x13d3a8);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_268.field_2._M_allocated_capacity = *psVar8;
            local_268.field_2._8_8_ = plVar5[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar8;
            local_268._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_268._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_288.field_2._M_allocated_capacity = *psVar8;
            local_288.field_2._8_8_ = plVar5[3];
            local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          }
          else {
            local_288.field_2._M_allocated_capacity = *psVar8;
            local_288._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_288._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                     &local_288);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p);
          }
          paVar13 = &local_1f8.field_2;
          _Var11._M_p = local_1f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
            _Var11._M_p = local_1f8._M_dataplus._M_p;
          }
        }
        else {
          paVar13 = &local_288.field_2;
          if (iVar3 != 2) {
            LogMessage::LogMessage
                      ((LogMessage *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_generator.cc"
                       ,0xb9,3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0 + 8),"Bad operator: ",0xe);
            pbVar7 = (post->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b0 + 8),
                       *(char **)((long)&(pbVar7->_M_dataplus)._M_p + lVar10),
                       *(long *)((long)&pbVar7->_M_string_length + lVar10));
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
            pbVar7 = (post->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0011be7e;
          }
          pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          local_1b0._0_8_ = local_1b0 + 0x10;
          pcVar1 = pbVar4[-1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b0,pcVar1,pcVar1 + pbVar4[-1]._M_string_length);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_248);
          pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          pcVar1 = pbVar4[-1]._M_dataplus._M_p;
          local_288._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,pcVar1,pcVar1 + pbVar4[-1]._M_string_length);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_248);
          StringPrintf_abi_cxx11_
                    (&local_1d0,
                     *(char **)((long)&(((post->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar10),local_288._M_dataplus._M_p,local_1b0._0_8_);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x13d3a8);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_1f8.field_2._M_allocated_capacity = *psVar8;
            local_1f8.field_2._8_8_ = plVar5[3];
          }
          else {
            local_1f8.field_2._M_allocated_capacity = *psVar8;
            local_1f8._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1f8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f8);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          psVar8 = puVar6 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_268.field_2._M_allocated_capacity = *psVar8;
            local_268.field_2._8_8_ = puVar6[3];
          }
          else {
            local_268.field_2._M_allocated_capacity = *psVar8;
            local_268._M_dataplus._M_p = (pointer)*puVar6;
          }
          local_268._M_string_length = puVar6[1];
          *puVar6 = psVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_248,
                     &local_268);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
          _Var11._M_p = local_288._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
            _Var11._M_p = local_288._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var11._M_p != paVar13) {
          operator_delete(_Var11._M_p);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
      }
      uVar12 = uVar12 + 1;
      pbVar7 = (post->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x20;
    } while (uVar12 < (ulong)((long)(post->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)
            );
  }
  if (((long)local_248._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_248._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
      ((long)local_248._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)local_248._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)local_248._M_impl.super__Deque_impl_data._M_finish._M_node -
                (long)local_248._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(local_248._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
      0x10 != 1) {
    puts("Bad regexp program:");
    pbVar7 = (post->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((post->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
      lVar10 = 8;
      uVar12 = 0;
      pSVar9 = extraout_RDX;
      do {
        local_288._M_dataplus._M_p = *(pointer *)((long)pbVar7 + lVar10 + -8);
        local_288._M_string_length =
             CONCAT44(local_288._M_string_length._4_4_,
                      *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar10));
        CEscape_abi_cxx11_((string *)local_1b0,(re2 *)&local_288,pSVar9);
        printf("  %s\n",local_1b0._0_8_);
        pSVar9 = extraout_RDX_00;
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
          pSVar9 = extraout_RDX_01;
        }
        uVar12 = uVar12 + 1;
        pbVar7 = (post->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x20;
      } while (uVar12 < (ulong)((long)(post->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >>
                               5));
    }
    puts("Stack after running program:");
    if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_248._M_impl.super__Deque_impl_data._M_start._M_cur) {
      pSVar9 = extraout_RDX_02;
      do {
        pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        local_288._M_dataplus._M_p = pbVar4[-1]._M_dataplus._M_p;
        local_288._M_string_length =
             CONCAT44(local_288._M_string_length._4_4_,(int)pbVar4[-1]._M_string_length);
        CEscape_abi_cxx11_((string *)local_1b0,(re2 *)&local_288,pSVar9);
        printf("  %s\n",local_1b0._0_8_);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_248);
        pSVar9 = extraout_RDX_03;
      } while (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_248._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    LogMessage::LogMessage
              ((LogMessage *)local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_generator.cc"
               ,0xdb,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Bad regexp program.",0x13);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1b0);
  }
  pRVar2 = local_1d8;
  pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  (*local_1d8->_vptr_RegexpGenerator[2])(local_1d8,pbVar4 + -1);
  pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::operator+(&local_288,"^(?:",pbVar4 + -1);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  pcVar1 = local_1b0 + 0x10;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_1b0._16_8_ = *psVar8;
    local_1b0._24_4_ = *(undefined4 *)(plVar5 + 3);
    local_1b0._28_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_1b0._0_8_ = pcVar1;
  }
  else {
    local_1b0._16_8_ = *psVar8;
    local_1b0._0_8_ = (size_type *)*plVar5;
  }
  local_1b0._8_8_ = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*pRVar2->_vptr_RegexpGenerator[2])(pRVar2);
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_);
  }
  paVar13 = &local_288.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::operator+(&local_288,"^(?:",pbVar4 + -1);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_1b0._16_8_ = *psVar8;
    local_1b0._24_4_ = *(undefined4 *)(plVar5 + 3);
    local_1b0._28_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_1b0._0_8_ = pcVar1;
  }
  else {
    local_1b0._16_8_ = *psVar8;
    local_1b0._0_8_ = (size_type *)*plVar5;
  }
  local_1b0._8_8_ = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*pRVar2->_vptr_RegexpGenerator[2])(pRVar2);
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_248._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_248._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pbVar4 = local_248._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
  }
  std::operator+(&local_288,"(?:",pbVar4 + -1);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_288);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_1b0._16_8_ = *psVar8;
    local_1b0._24_4_ = *(undefined4 *)(plVar5 + 3);
    local_1b0._28_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_1b0._0_8_ = pcVar1;
  }
  else {
    local_1b0._16_8_ = *psVar8;
    local_1b0._0_8_ = (size_type *)*plVar5;
  }
  local_1b0._8_8_ = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*pRVar2->_vptr_RegexpGenerator[2])(pRVar2);
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_248);
  return;
}

Assistant:

void RegexpGenerator::RunPostfix(const vector<string>& post) {
  stack<string> regexps;
  for (size_t i = 0; i < post.size(); i++) {
    switch (CountArgs(post[i])) {
      default:
        LOG(FATAL) << "Bad operator: " << post[i];
      case 0:
        regexps.push(post[i]);
        break;
      case 1: {
        string a = regexps.top();
        regexps.pop();
        regexps.push("(?:" + StringPrintf(post[i].c_str(), a.c_str()) + ")");
        break;
      }
      case 2: {
        string b = regexps.top();
        regexps.pop();
        string a = regexps.top();
        regexps.pop();
        regexps.push("(?:" +
                     StringPrintf(post[i].c_str(), a.c_str(), b.c_str()) +
                     ")");
        break;
      }
    }
  }

  if (regexps.size() != 1) {
    // Internal error - should never happen.
    printf("Bad regexp program:\n");
    for (size_t i = 0; i < post.size(); i++) {
      printf("  %s\n", CEscape(post[i]).c_str());
    }
    printf("Stack after running program:\n");
    while (!regexps.empty()) {
      printf("  %s\n", CEscape(regexps.top()).c_str());
      regexps.pop();
    }
    LOG(FATAL) << "Bad regexp program.";
  }

  HandleRegexp(regexps.top());
  HandleRegexp("^(?:" + regexps.top() + ")$");
  HandleRegexp("^(?:" + regexps.top() + ")");
  HandleRegexp("(?:" + regexps.top() + ")$");
}